

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cc
# Opt level: O1

void __thiscall
onmt::Tokenizer::finalize_tokens
          (Tokenizer *this,vector<onmt::Token,_std::allocator<onmt::Token>_> *annotated_tokens,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tokens,vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  *features)

{
  bool bVar1;
  pointer pcVar2;
  pointer pvVar3;
  size_type sVar4;
  char cVar5;
  long lVar6;
  pointer pTVar7;
  uint *puVar8;
  long *plVar9;
  Casing CVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  string *psVar12;
  byte bVar13;
  byte bVar14;
  string *psVar15;
  pointer pbVar16;
  undefined8 uVar17;
  undefined1 *puVar18;
  _Alloc_hider _Var19;
  long lVar20;
  vector<onmt::Token,_std::allocator<onmt::Token>_> *pvVar21;
  _Alloc_hider _Var22;
  ulong uVar23;
  string final_token;
  string local_188;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_168;
  Casing local_15c;
  ulong local_158;
  undefined1 *local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_128;
  vector<onmt::Token,_std::allocator<onmt::Token>_> *local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  long *local_f8 [2];
  long local_e8 [2];
  string *local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_168 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)tokens;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(tokens,((long)(annotated_tokens->
                          super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>)._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)(annotated_tokens->
                          super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>)._M_impl.
                          super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7);
  pTVar7 = (annotated_tokens->super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>)._M_impl
           .super__Vector_impl_data._M_start;
  if (((annotated_tokens->super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>)._M_impl.
       super__Vector_impl_data._M_finish == pTVar7) ||
     (pbVar16 = (pTVar7->features).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start,
     pbVar16 ==
     (pTVar7->features).
     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
     ._M_impl.super__Vector_impl_data._M_finish)) {
    lVar6 = 0;
  }
  else {
    lVar6 = (long)(pTVar7->features).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar16 >> 5;
  }
  lVar6 = (ulong)(this->_options).case_feature + lVar6;
  if (lVar6 != 0) {
    do {
      local_188._M_dataplus._M_p = local_188._M_dataplus._M_p & 0xffffffff00000000;
      std::
      vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::emplace_back<int>(features,(int *)&local_188);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::reserve((features->
                super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish + -1,
                ((long)(annotated_tokens->
                       super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>)._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(annotated_tokens->
                       super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>)._M_impl.
                       super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7);
      lVar6 = lVar6 + -1;
    } while (lVar6 != 0);
  }
  if ((this->_options).case_markup == false) {
    local_158 = 0;
    _Var22._M_p = (pointer)0x0;
  }
  else {
    get_case_markups((vector<onmt::TokenCaseMarkup,_std::allocator<onmt::TokenCaseMarkup>_> *)
                     &local_188,annotated_tokens,(this->_options).soft_case_regions);
    local_158 = local_188.field_2._M_allocated_capacity;
    _Var22._M_p = local_188._M_dataplus._M_p;
  }
  pTVar7 = (annotated_tokens->super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>)._M_impl
           .super__Vector_impl_data._M_start;
  if ((annotated_tokens->super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>)._M_impl.
      super__Vector_impl_data._M_finish != pTVar7) {
    psVar12 = &(this->_options).joiner;
    puVar18 = (undefined1 *)0x0;
    local_128 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var22._M_p;
    local_120 = annotated_tokens;
    local_d8 = psVar12;
    do {
      CVar10 = (Casing)psVar12;
      pTVar7 = pTVar7 + (long)puVar18;
      local_15c = pTVar7->casing;
      local_150 = puVar18;
      if (((pTVar7->features).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start !=
           (pTVar7->features).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish) &&
         (pbVar16 = (pTVar7->features).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
         (pTVar7->features).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish != pbVar16)) {
        lVar20 = 0;
        lVar6 = 0;
        uVar23 = 0;
        do {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)((long)&(((features->
                                   super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data + lVar6),
                      (value_type *)((long)&(pbVar16->_M_dataplus)._M_p + lVar20));
          CVar10 = (Casing)psVar12;
          uVar23 = uVar23 + 1;
          pbVar16 = (pTVar7->features).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar6 = lVar6 + 0x18;
          lVar20 = lVar20 + 0x20;
        } while (uVar23 < (ulong)((long)(pTVar7->features).
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar16
                                 >> 5));
      }
      _Var22._M_p = (pointer)local_128;
      if (((this->_options).case_markup == true) &&
         (*(int *)((long)local_128 + (long)local_150 * 0xc) != 0)) {
        puVar8 = (uint *)((long)local_128 + (long)local_150 * 0xc);
        write_case_markup_abi_cxx11_(&local_188,(onmt *)(ulong)*puVar8,puVar8[2],CVar10);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(local_168,&local_188);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p != &local_188.field_2) {
          operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
        }
      }
      pvVar21 = local_120;
      bVar1 = pTVar7->preserve;
      if ((this->_options).joiner_annotate == true) {
        psVar12 = (string *)0x0;
        if (pTVar7->join_left != false) {
          psVar12 = local_d8;
        }
        if (local_150 == (undefined1 *)0x0) {
          psVar12 = (string *)0x0;
        }
        psVar15 = (string *)0x0;
        if ((pTVar7->join_right == true) &&
           (psVar15 = (string *)0x0,
           local_150 + 1 <
           (undefined1 *)
           (((long)(local_120->super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(local_120->super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>).
                   _M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7))) {
          psVar15 = local_d8;
        }
        bVar13 = (this->_options).joiner_new ^ 1;
        bVar14 = 0;
        if (pTVar7->spacer != false) {
          bVar14 = bVar13;
        }
        if (bVar1 == false) {
          bVar14 = bVar13;
        }
      }
      else if ((this->_options).spacer_annotate == true) {
        if (local_150 == (undefined1 *)0x0) {
          if (pTVar7->spacer != false) goto LAB_001b470e;
LAB_001b4731:
          psVar12 = (string *)0x0;
        }
        else {
          if ((pTVar7->join_left != false) ||
             ((local_120->super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>)._M_impl.
              super__Vector_impl_data._M_start[(long)(puVar18 + -1)].join_right != false))
          goto LAB_001b4731;
LAB_001b470e:
          psVar12 = (string *)&spacer_marker_abi_cxx11_;
        }
        bVar14 = (this->_options).spacer_new ^ 1;
        if (bVar1 != false) {
          bVar14 = 0;
        }
        psVar15 = (string *)0x0;
      }
      else {
        psVar12 = (string *)0x0;
        psVar15 = (string *)0x0;
        bVar14 = bVar1 ^ 1;
      }
      paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((ulong)psVar12 | (ulong)psVar15);
      if (paVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        bVar1 = (this->_options).case_feature;
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        pcVar2 = (pTVar7->surface)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,pcVar2,pcVar2 + (pTVar7->surface)._M_string_length);
        CVar10 = (Casing)paVar11;
        if ((local_50._M_string_length != 0) &&
           (std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>(local_168,&local_50), bVar1 != false)) {
          pvVar3 = (features->
                   super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          local_188._M_dataplus._M_p._0_4_ = 1;
          cVar5 = casing_to_char(local_15c);
          local_148._M_dataplus._M_p._0_4_ = CONCAT31(local_148._M_dataplus._M_p._1_3_,cVar5);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<int,char>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     (pvVar3 + -1),(int *)&local_188,(char *)&local_148);
        }
        uVar17 = local_50.field_2._M_allocated_capacity;
        _Var19._M_p = local_50._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
LAB_001b4c75:
          operator_delete(_Var19._M_p,uVar17 + 1);
        }
      }
      else if ((bVar14 & 1) == 0) {
        if (psVar12 != (string *)0x0) {
          bVar1 = (this->_options).case_feature;
          paVar11 = &local_70.field_2;
          pcVar2 = (psVar12->_M_dataplus)._M_p;
          local_70._M_dataplus._M_p = (pointer)paVar11;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_70,pcVar2,pcVar2 + psVar12->_M_string_length);
          if ((local_70._M_string_length != 0) &&
             (std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>(local_168,&local_70), pvVar21 = local_120,
             bVar1 != false)) {
            pvVar3 = (features->
                     super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
            local_188._M_dataplus._M_p._0_4_ = 1;
            cVar5 = casing_to_char(None);
            local_148._M_dataplus._M_p._0_4_ = CONCAT31(local_148._M_dataplus._M_p._1_3_,cVar5);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<int,char>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       (pvVar3 + -1),(int *)&local_188,(char *)&local_148);
            pvVar21 = local_120;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
        }
        CVar10 = (Casing)paVar11;
        bVar1 = (this->_options).case_feature;
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        pcVar2 = (pTVar7->surface)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,pcVar2,pcVar2 + (pTVar7->surface)._M_string_length);
        if ((local_90._M_string_length != 0) &&
           (std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>(local_168,&local_90), bVar1 != false)) {
          pvVar3 = (features->
                   super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          local_188._M_dataplus._M_p._0_4_ = 1;
          cVar5 = casing_to_char(local_15c);
          local_148._M_dataplus._M_p._0_4_ = CONCAT31(local_148._M_dataplus._M_p._1_3_,cVar5);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<int,char>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     (pvVar3 + -1),(int *)&local_188,(char *)&local_148);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        if (psVar15 != (string *)0x0) {
          bVar1 = (this->_options).case_feature;
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          pcVar2 = (psVar15->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b0,pcVar2,pcVar2 + psVar15->_M_string_length);
          if ((local_b0._M_string_length != 0) &&
             (std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>(local_168,&local_b0), bVar1 != false)) {
            pvVar3 = (features->
                     super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
            local_188._M_dataplus._M_p._0_4_ = 1;
            cVar5 = casing_to_char(None);
            local_148._M_dataplus._M_p._0_4_ = CONCAT31(local_148._M_dataplus._M_p._1_3_,cVar5);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<int,char>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       (pvVar3 + -1),(int *)&local_188,(char *)&local_148);
          }
          uVar17 = local_b0.field_2._M_allocated_capacity;
          _Var19._M_p = local_b0._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) goto LAB_001b4c75;
        }
      }
      else {
        if (psVar12 == (string *)0x0) {
          local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"");
        }
        else {
          local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
          pcVar2 = (psVar12->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_118,pcVar2,pcVar2 + psVar12->_M_string_length);
        }
        std::operator+(&local_148,&local_118,&pTVar7->surface);
        local_f8[0] = local_e8;
        if (psVar15 == (string *)0x0) {
          std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"");
        }
        else {
          pcVar2 = (psVar15->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_f8,pcVar2,pcVar2 + psVar15->_M_string_length);
        }
        plVar9 = (long *)std::__cxx11::string::_M_append((char *)&local_148,(ulong)local_f8[0]);
        paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 == paVar11) {
          local_188.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
          local_188.field_2._8_8_ = plVar9[3];
          local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
        }
        else {
          local_188.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
          local_188._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_188._M_string_length = plVar9[1];
        *plVar9 = (long)paVar11;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        if (local_f8[0] != local_e8) {
          operator_delete(local_f8[0],local_e8[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_148._M_dataplus._M_p._4_4_,local_148._M_dataplus._M_p._0_4_) !=
            &local_148.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_148._M_dataplus._M_p._4_4_,local_148._M_dataplus._M_p._0_4_
                                  ),local_148.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
        }
        sVar4 = local_188._M_string_length;
        bVar1 = (this->_options).case_feature;
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        paVar11 = &local_188.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p == paVar11) {
          local_d0.field_2._8_8_ = local_188.field_2._8_8_;
        }
        else {
          local_d0._M_dataplus._M_p = local_188._M_dataplus._M_p;
        }
        local_d0.field_2._M_allocated_capacity = local_188.field_2._M_allocated_capacity;
        local_d0._M_string_length = local_188._M_string_length;
        local_188._M_string_length = 0;
        local_188.field_2._M_allocated_capacity =
             local_188.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_188._M_dataplus._M_p = (pointer)paVar11;
        if ((sVar4 != 0) &&
           (std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>(local_168,&local_d0), bVar1 != false)) {
          pvVar3 = (features->
                   super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          local_148._M_dataplus._M_p._0_4_ = 1;
          cVar5 = casing_to_char(local_15c);
          local_118._M_dataplus._M_p._0_1_ = cVar5;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<int,char>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     (pvVar3 + -1),(int *)&local_148,(char *)&local_118);
        }
        CVar10 = (Casing)paVar11;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
        uVar17 = local_188.field_2._M_allocated_capacity;
        _Var19._M_p = local_188._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p != &local_188.field_2) goto LAB_001b4c75;
      }
      if (((this->_options).case_markup == true) &&
         (*(int *)((long)_Var22._M_p + (long)local_150 * 0xc + 4) != 0)) {
        write_case_markup_abi_cxx11_
                  (&local_188,
                   (onmt *)(ulong)*(uint *)((long)_Var22._M_p + (long)local_150 * 0xc + 4),
                   *(CaseMarkupType *)((long)_Var22._M_p + (long)local_150 * 0xc + 8),CVar10);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(local_168,&local_188);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p != &local_188.field_2) {
          operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
        }
      }
      puVar18 = local_150 + 1;
      pTVar7 = (pvVar21->super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>)._M_impl.
               super__Vector_impl_data._M_start;
      psVar12 = (string *)
                (((long)(pvVar21->super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pTVar7 >> 3) *
                -0x71c71c71c71c71c7);
    } while (puVar18 < psVar12);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var22._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(_Var22._M_p,local_158 - (long)_Var22._M_p);
  }
  return;
}

Assistant:

void Tokenizer::finalize_tokens(const std::vector<Token>& annotated_tokens,
                                  std::vector<std::string>& tokens,
                                  std::vector<std::vector<std::string>>& features) const
  {
    tokens.reserve(annotated_tokens.size());
    size_t num_features = 0;
    if (annotated_tokens.size() > 0 && annotated_tokens[0].has_features())
      num_features = annotated_tokens[0].features.size();
    if (_options.case_feature)
      num_features += 1;

    for (size_t i = 0; i < num_features; ++i)
    {
      features.emplace_back(0);
      features.back().reserve(annotated_tokens.size());
    }

    std::vector<TokenCaseMarkup> case_markups;
    if (_options.case_markup)
      case_markups = get_case_markups(annotated_tokens, _options.soft_case_regions);

    for (size_t i = 0; i < annotated_tokens.size(); ++i)
    {
      const auto& token = annotated_tokens[i];
      const auto& str = token.surface;
      const auto casing = token.casing;

      if (token.has_features())
      {
        const auto& token_features = token.features;
        for (size_t j = 0; j < token_features.size(); ++j)
          features[j].push_back(token_features[j]);
      }

      if (_options.case_markup && case_markups[i].prefix != CaseMarkupType::None)
        tokens.emplace_back(write_case_markup(case_markups[i].prefix, case_markups[i].casing));

      const std::string* prefix = nullptr;
      const std::string* suffix = nullptr;
      bool attach = !token.preserve;

      if (_options.joiner_annotate)
      {
        if (token.join_left && i > 0)
          prefix = &_options.joiner;
        if (token.join_right && i + 1 < annotated_tokens.size())
          suffix = &_options.joiner;
        if (token.spacer)
          attach = true;  // Ignore preserve flag for spacers in joiner mode.
        attach = attach && !_options.joiner_new;
      }
      else if (_options.spacer_annotate)
      {
        if ((i == 0 && token.spacer)
            || (i > 0 && !token.join_left && !annotated_tokens[i - 1].join_right))
          prefix = &spacer_marker;
        attach = attach && !_options.spacer_new;
      }

      if (!prefix && !suffix)
        add_final_token(tokens, features, _options.case_feature, str, casing);
      else if (attach)
      {
        std::string final_token = (prefix ? *prefix : "") + str + (suffix ? *suffix : "");
        add_final_token(tokens, features, _options.case_feature, std::move(final_token), casing);
      }
      else
      {
        if (prefix)
          add_final_token(tokens, features, _options.case_feature, *prefix);
        add_final_token(tokens, features, _options.case_feature, str, casing);
        if (suffix)
          add_final_token(tokens, features, _options.case_feature, *suffix);
      }

      if (_options.case_markup && case_markups[i].suffix != CaseMarkupType::None)
        tokens.emplace_back(write_case_markup(case_markups[i].suffix, case_markups[i].casing));
    }
  }